

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor,
          bool immutable,bool kotlin)

{
  char *pcVar1;
  FileDescriptor *file;
  long *plVar2;
  bool bVar3;
  undefined7 in_register_00000009;
  anon_unknown_0 *this_00;
  string_view sVar4;
  string_view name_without_package;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pcVar1 = (descriptor->all_names_).payload_;
  this_00 = (anon_unknown_0 *)(ulong)*(ushort *)(pcVar1 + 2);
  sVar4._M_len = pcVar1 + ~(ulong)this_00;
  sVar4._M_str = (char *)descriptor->file_;
  sVar4 = java::anon_unknown_0::StripPackageName
                    (this_00,sVar4,(FileDescriptor *)CONCAT71(in_register_00000009,immutable));
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,sVar4._M_str,sVar4._M_str + sVar4._M_len);
  plVar2 = local_50;
  file = descriptor->file_;
  bVar3 = NestedInFileClass(descriptor,immutable);
  name_without_package._M_str = (char *)plVar2;
  name_without_package._M_len = local_48;
  GetClassFullName_abi_cxx11_
            (__return_storage_ptr__,this,name_without_package,file,immutable,!bVar3,kotlin);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetClassName(const Descriptor* descriptor,
                                            bool immutable, bool kotlin) {
  return GetClassFullName(ClassNameWithoutPackage(descriptor, immutable),
                          descriptor->file(), immutable,
                          !NestedInFileClass(*descriptor, immutable), kotlin);
}